

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::ListReverseSortFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  ScalarFunctionSet *in_RDI;
  ScalarFunction sort_reverse_null_order;
  ScalarFunction sort_reverse;
  ScalarFunctionSet *list_reverse_sort;
  allocator_type *in_stack_fffffffffffff8b8;
  allocator_type *paVar3;
  ScalarFunction *function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff8c0;
  vector<duckdb::LogicalType,_true> *this;
  ScalarFunction *this_00;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffff8c8;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *__f;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff8d4;
  undefined4 in_stack_fffffffffffff8dc;
  LogicalType *in_stack_fffffffffffff8e0;
  LogicalType *this_01;
  ScalarFunction *this_02;
  ScalarFunctionSet *in_stack_fffffffffffff900;
  LogicalType *in_stack_fffffffffffff908;
  undefined1 **local_6b0;
  undefined1 **local_690;
  bind_scalar_function_extended_t in_stack_fffffffffffff9e0;
  bind_scalar_function_t in_stack_fffffffffffff9e8;
  scalar_function_t *in_stack_fffffffffffff9f0;
  LogicalType *in_stack_fffffffffffff9f8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffa00;
  ScalarFunction *in_stack_fffffffffffffa08;
  function_statistics_t in_stack_fffffffffffffa40;
  init_local_state_t in_stack_fffffffffffffa48;
  LogicalType *in_stack_fffffffffffffa50;
  FunctionStability in_stack_fffffffffffffa58;
  FunctionNullHandling in_stack_fffffffffffffa60;
  bind_lambda_function_t in_stack_fffffffffffffa68;
  undefined1 *local_388 [6];
  undefined8 *local_358;
  undefined8 local_350;
  undefined1 local_208 [107];
  undefined1 local_19d;
  undefined8 *local_178;
  undefined1 *local_170 [3];
  undefined8 *local_158;
  undefined8 local_150;
  
  local_19d = 1;
  local_178 = local_170;
  LogicalType::LogicalType
            (in_stack_fffffffffffff8e0,(LogicalTypeId)((uint)in_stack_fffffffffffff8dc >> 0x18));
  LogicalType::LIST(in_stack_fffffffffffff908);
  local_19d = 0;
  local_158 = local_170;
  local_150 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x202bc9e);
  iVar1._M_len._0_4_ = in_stack_fffffffffffff8d0;
  iVar1._M_array = (iterator)in_stack_fffffffffffff8c8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffff8d4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffff8c0,iVar1,in_stack_fffffffffffff8b8);
  LogicalType::LogicalType
            (in_stack_fffffffffffff8e0,(LogicalTypeId)((uint)in_stack_fffffffffffff8dc >> 0x18));
  LogicalType::LIST(in_stack_fffffffffffff908);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),in_stack_fffffffffffff8c8
            );
  LogicalType::LogicalType
            (in_stack_fffffffffffff8e0,(LogicalTypeId)((uint)in_stack_fffffffffffff8dc >> 0x18));
  __f = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_208;
  this_01 = (LogicalType *)0x0;
  uVar4 = 0;
  this = (vector<duckdb::LogicalType,_true> *)0x0;
  paVar3 = (allocator_type *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
             in_stack_fffffffffffffa40,in_stack_fffffffffffffa48,in_stack_fffffffffffffa50,
             in_stack_fffffffffffffa58,in_stack_fffffffffffffa60,in_stack_fffffffffffffa68);
  LogicalType::~LogicalType((LogicalType *)0x202bd89);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x202bd96);
  LogicalType::~LogicalType((LogicalType *)0x202bda3);
  LogicalType::~LogicalType((LogicalType *)0x202bdb0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x202bdbd);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x202bdca);
  local_690 = (undefined1 **)&local_158;
  do {
    local_690 = local_690 + -3;
    LogicalType::~LogicalType((LogicalType *)0x202bdff);
  } while (local_690 != local_170);
  LogicalType::~LogicalType((LogicalType *)0x202be29);
  LogicalType::LogicalType(this_01,(LogicalTypeId)((uint)in_stack_fffffffffffff8dc >> 0x18));
  LogicalType::LIST(in_stack_fffffffffffff908);
  LogicalType::LogicalType(this_01,(LogicalTypeId)((uint)in_stack_fffffffffffff8dc >> 0x18));
  local_358 = local_388;
  local_350 = 2;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x202bec1);
  iVar2._M_len._0_4_ = uVar4;
  iVar2._M_array = (iterator)__f;
  iVar2._M_len._4_4_ = in_stack_fffffffffffff8d4;
  vector<duckdb::LogicalType,_true>::vector(this,iVar2,paVar3);
  LogicalType::LogicalType(this_01,(LogicalTypeId)((uint)in_stack_fffffffffffff8dc >> 0x18));
  LogicalType::LIST(in_stack_fffffffffffff908);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff8d4,uVar4),__f);
  LogicalType::LogicalType(this_01,(LogicalTypeId)((uint)in_stack_fffffffffffff8dc >> 0x18));
  this_02 = (ScalarFunction *)0x0;
  uVar4 = 0;
  this_00 = (ScalarFunction *)0x0;
  function = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
             in_stack_fffffffffffffa40,in_stack_fffffffffffffa48,in_stack_fffffffffffffa50,
             in_stack_fffffffffffffa58,in_stack_fffffffffffffa60,in_stack_fffffffffffffa68);
  LogicalType::~LogicalType((LogicalType *)0x202bfac);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x202bfb9);
  LogicalType::~LogicalType((LogicalType *)0x202bfc6);
  LogicalType::~LogicalType((LogicalType *)0x202bfd3);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x202bfe0);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x202bfed);
  local_6b0 = (undefined1 **)&local_358;
  do {
    local_6b0 = local_6b0 + -3;
    LogicalType::~LogicalType((LogicalType *)0x202c022);
  } while (local_6b0 != local_388);
  LogicalType::~LogicalType((LogicalType *)0x202c04c);
  ScalarFunctionSet::ScalarFunctionSet(in_stack_fffffffffffff900);
  ScalarFunction::ScalarFunction
            (this_02,(ScalarFunction *)CONCAT44(in_stack_fffffffffffff8dc,uVar4));
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this_00,function);
  ScalarFunction::~ScalarFunction(this_00);
  ScalarFunction::ScalarFunction
            (this_02,(ScalarFunction *)CONCAT44(in_stack_fffffffffffff8dc,uVar4));
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this_00,function);
  ScalarFunction::~ScalarFunction(this_00);
  ScalarFunction::~ScalarFunction(this_00);
  ScalarFunction::~ScalarFunction(this_00);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ListReverseSortFun::GetFunctions() {
	// one parameter: list
	ScalarFunction sort_reverse({LogicalType::LIST(LogicalType::ANY)}, LogicalType::LIST(LogicalType::ANY),
	                            ListSortFunction, ListReverseSortBind);

	// two parameters: list, null order
	ScalarFunction sort_reverse_null_order({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR},
	                                       LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListReverseSortBind);

	ScalarFunctionSet list_reverse_sort;
	list_reverse_sort.AddFunction(sort_reverse);
	list_reverse_sort.AddFunction(sort_reverse_null_order);
	return list_reverse_sort;
}